

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

monster_conflict * choose_nearby_injured_kin(chunk *c,monster_conflict *mon)

{
  wchar_t wVar1;
  uint32_t uVar2;
  monster_conflict *pmVar3;
  loc grid;
  wchar_t wVar4;
  monster_conflict *pmVar5;
  wchar_t wVar6;
  uint32_t m;
  
  wVar4 = (mon->grid).y;
  m = 0;
  pmVar5 = (monster_conflict *)0x0;
  for (wVar6 = wVar4 + L'\xfffffffb'; wVar6 <= wVar4 + L'\x05'; wVar6 = wVar6 + L'\x01') {
    wVar1 = (mon->grid).x;
    for (wVar4 = wVar1 + L'\xfffffffb'; wVar4 <= wVar1 + L'\x05'; wVar4 = wVar4 + L'\x01') {
      grid.y = wVar6;
      grid.x = wVar4;
      pmVar3 = get_injured_kin(c,mon,grid);
      if (pmVar3 != (monster_conflict *)0x0) {
        m = m + 1;
        uVar2 = Rand_div(m);
        if (uVar2 == 0) {
          pmVar5 = pmVar3;
        }
      }
      wVar1 = (mon->grid).x;
    }
    wVar4 = (mon->grid).y;
  }
  return pmVar5;
}

Assistant:

struct monster *choose_nearby_injured_kin(struct chunk *c,
                                          const struct monster *mon)
{
	struct loc grid;
	int nseen = 0;
	struct monster *found = NULL;

	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			struct monster *kin = get_injured_kin(c, mon, grid);
			if (kin) {
				nseen++;
				if (!randint0(nseen))
					found = kin;
			}
		}
	}

	return found;
}